

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RefCountedObject.h
# Opt level: O3

void soul::RefCountedPtr<soul::Structure>::decIfNotNull(Structure *o)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint32_t uVar3;
  
  if (o != (Structure *)0x0) {
    uVar3 = (o->super_RefCountedObject).refCount;
    if (uVar3 == 0) {
      throwInternalCompilerError("o->refCount > 0","decIfNotNull",0x69);
    }
    uVar3 = uVar3 - 1;
    (o->super_RefCountedObject).refCount = uVar3;
    if (uVar3 == 0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&(o->memberIndexMap)._M_h);
      pcVar2 = (o->name)._M_dataplus._M_p;
      paVar1 = &(o->name).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      ArrayWithPreallocation<soul::Structure::Member,_8UL>::clear(&o->members);
      operator_delete(o,0x288);
      return;
    }
  }
  return;
}

Assistant:

static void decIfNotNull (ObjectType* o)
    {
        if (o != nullptr)
        {
            SOUL_ASSERT (o->refCount > 0);

            if (--(o->refCount) == 0)
                delete o;
        }
    }